

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O2

void __thiscall cppforth::Forth::fileReposition(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  _Ios_Seekdir _Var2;
  allocator<char> local_61;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> f;
  string local_50 [32];
  
  requireDStackDepth(this,3,"REPOSITION-FILE");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  _Var2 = ForthStack<unsigned_int>::getTop(this_00,1);
  ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"REPOSITION-FILE",&local_61);
  GetFileHandle((Forth *)&f,(Cell)this,(string *)(ulong)uVar1,(errorCodes)local_50);
  std::__cxx11::string::~string(local_50);
  std::ios::clear((int)f.
                       super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr +
                  (int)*(undefined8 *)
                        (*(long *)f.
                                  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + -0x18));
  std::istream::seekg((long)f.
                            super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,_Var2);
  ForthStack<unsigned_int>::setTop
            (this_00,-(*(uint *)(f.
                                 super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr +
                                *(long *)(*(long *)f.
                                                  super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr + -0x18) + 0x20) & 1) & 0xffffffbf);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f.
              super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void fileReposition() {
	REQUIRE_DSTACK_DEPTH(3, "REPOSITION-FILE");
	auto h = (dStack.getTop()); dStack.pop();
	DCell ud(dStack.getTop(1), dStack.getTop()); dStack.pop();
	auto f = GetFileHandle(h, "REPOSITION-FILE", errorFilePosition);
	f->clear();
	f->seekg(ud.data_.Dcells , std::ios_base::beg);
	auto status = f->rdstate();
	dStack.setTop(f->bad() ? Cell(errorFilePosition) : 0);
}